

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::MergeReturnPass::AddSingleCaseSwitchAroundFunction(MergeReturnPass *this)

{
  IRContext *pIVar1;
  bool bVar2;
  
  CreateReturnBlock(this);
  CreateReturn(this,this->final_return_block_);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisCFG) != kAnalysisNone) {
    CFG::RegisterBlock((pIVar1->cfg_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                       .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,
                       this->final_return_block_);
  }
  bVar2 = CreateSingleCaseSwitch(this,this->final_return_block_);
  return bVar2;
}

Assistant:

bool MergeReturnPass::AddSingleCaseSwitchAroundFunction() {
  CreateReturnBlock();
  CreateReturn(final_return_block_);

  if (context()->AreAnalysesValid(IRContext::kAnalysisCFG)) {
    cfg()->RegisterBlock(final_return_block_);
  }

  if (!CreateSingleCaseSwitch(final_return_block_)) {
    return false;
  }
  return true;
}